

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O2

int cinatra::detail::phr_parse_request
              (char *buf_start,size_t len,char **method,size_t *method_len,char **path,
              size_t *path_len,int *minor_version,http_header *headers,size_t *num_headers,
              size_t last_len,bool *has_connection,bool *has_close,bool *has_upgrade,bool *has_query
              )

{
  byte *buf_end;
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  int r;
  size_t local_48;
  char **local_40;
  size_t *local_38;
  
  local_48 = *num_headers;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  buf_end = (byte *)(buf_start + len);
  *minor_version = -1;
  *num_headers = 0;
  local_40 = path;
  local_38 = path_len;
  if ((last_len != 0) &&
     (pcVar2 = is_complete(buf_start,(char *)buf_end,last_len,&r), pcVar2 == (char *)0x0)) {
    return r;
  }
  if (last_len == len) {
    return -2;
  }
  pbVar5 = (byte *)(buf_start + last_len);
  if (*pbVar5 == 10) {
    pbVar5 = pbVar5 + 1;
  }
  else if (*pbVar5 == 0xd) {
    if (pbVar5 + 1 == buf_end) {
      return -2;
    }
    if (pbVar5[1] != 10) {
      return -1;
    }
    pbVar5 = pbVar5 + 2;
  }
  if (pbVar5 == buf_end) {
    return -2;
  }
  sVar4 = 0;
  do {
    pbVar3 = pbVar5 + sVar4 + 1;
    bVar1 = pbVar5[sVar4];
    if (bVar1 == 0x20) {
      *method = (char *)pbVar5;
      *method_len = sVar4;
      if (pbVar3 == buf_end) {
        return -2;
      }
      sVar4 = 0;
      pbVar5 = pbVar3;
      do {
        bVar1 = *pbVar5;
        if (bVar1 == 0x20) {
          *local_40 = (char *)pbVar3;
          *local_38 = sVar4;
          pcVar2 = parse_http_version((char *)(pbVar5 + 1),(char *)buf_end,minor_version,&r);
          if (pcVar2 == (char *)0x0) {
            return r;
          }
          if (*pcVar2 == '\n') {
            pcVar2 = pcVar2 + 1;
          }
          else {
            if (*pcVar2 != '\r') {
              return -1;
            }
            if ((byte *)(pcVar2 + 1) == buf_end) {
              return -2;
            }
            if (pcVar2[1] != '\n') {
              return -1;
            }
            pcVar2 = pcVar2 + 2;
          }
          pcVar2 = parse_headers(pcVar2,(char *)buf_end,headers,num_headers,local_48,&r,
                                 has_connection,has_close,has_upgrade);
          if (pcVar2 != (char *)0x0) {
            return (int)pcVar2 - ((int)buf_start + (int)last_len);
          }
          return r;
        }
        if (bVar1 - 0x7f < 0xffffffa1) {
          if (bVar1 < 0x20) {
            return -1;
          }
          if (bVar1 == 0x7f) {
            return -1;
          }
        }
        else if (bVar1 == 0x3f) {
          *has_query = true;
        }
        pbVar5 = pbVar5 + 1;
        sVar4 = sVar4 + 1;
        if (pbVar5 == buf_end) {
          return -2;
        }
      } while( true );
    }
    if (bVar1 - 0x7f < 0xffffffa1) {
      if (bVar1 < 0x20) {
        return -1;
      }
      if (bVar1 == 0x7f) {
        return -1;
      }
    }
    sVar4 = sVar4 + 1;
    if (pbVar3 == buf_end) {
      return -2;
    }
  } while( true );
}

Assistant:

inline int phr_parse_request(const char *buf_start, size_t len,
                             const char **method, size_t *method_len,
                             const char **path, size_t *path_len,
                             int *minor_version, http_header *headers,
                             size_t *num_headers, size_t last_len,
                             bool &has_connection, bool &has_close,
                             bool &has_upgrade, bool &has_query) {
  const char *buf = buf_start, *buf_end = buf_start + len;
  size_t max_headers = *num_headers;
  int r;

  *method = NULL;
  *method_len = 0;
  *path = NULL;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;

  /* if last_len != 0, check if the request is complete (a fast countermeasure
  againt slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_request(buf + last_len, buf_end, method, method_len, path,
                           path_len, minor_version, headers, num_headers,
                           max_headers, &r, has_connection, has_close,
                           has_upgrade, has_query)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start - last_len);
}